

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2sAnalyzer.cpp
# Opt level: O2

void __thiscall
I2sAnalyzer::GetNextBit(I2sAnalyzer *this,BitState *data,BitState *frame,U64 *sample_number)

{
  BitState BVar1;
  U64 UVar2;
  
  AnalyzerChannelData::AdvanceToNextEdge();
  UVar2 = AnalyzerChannelData::GetSampleNumber();
  AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mData);
  BVar1 = AnalyzerChannelData::GetBitState();
  *data = BVar1;
  AnalyzerChannelData::AdvanceToAbsPosition((ulonglong)this->mFrame);
  BVar1 = AnalyzerChannelData::GetBitState();
  *frame = BVar1;
  *sample_number = UVar2;
  AnalyzerResults::AddMarker
            ((ulonglong)(this->mResults)._M_ptr,(MarkerType)UVar2,
             (Channel *)(ulong)this->mArrowMarker);
  AnalyzerChannelData::AdvanceToNextEdge();
  return;
}

Assistant:

void I2sAnalyzer::GetNextBit( BitState& data, BitState& frame, U64& sample_number )
{
    // we always start off here so that the next edge is where the data is valid.
    mClock->AdvanceToNextEdge();
    U64 data_valid_sample = mClock->GetSampleNumber();

    mData->AdvanceToAbsPosition( data_valid_sample );
    data = mData->GetBitState();

    mFrame->AdvanceToAbsPosition( data_valid_sample );
    frame = mFrame->GetBitState();

    sample_number = data_valid_sample;

    mResults->AddMarker( data_valid_sample, mArrowMarker, mSettings->mClockChannel );

    mClock->AdvanceToNextEdge(); // advance one more, so we're ready for next this function is called.
}